

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cbify.cc
# Opt level: O1

void predict_or_learn_adf<false,true>(cbify *data,multi_learner *base,example *ec)

{
  uint uVar1;
  wclass *pwVar2;
  wclass *pwVar3;
  example *peVar4;
  size_t sVar5;
  action_score *paVar6;
  int iVar7;
  vw_exception *pvVar8;
  uint32_t uVar9;
  wclass *pwVar10;
  wclass *__end1;
  polylabel *this;
  float fVar11;
  uint32_t chosen_action;
  cb_class cl;
  stringstream __msg;
  uint local_20c;
  cb_class local_208;
  string local_1f8;
  string local_1d8;
  pointer_____offset_0x10___ *local_1b8;
  float *local_1b0;
  ostream local_1a8;
  
  pwVar2 = (ec->l).cs.costs._begin;
  pwVar3 = (ec->l).cs.costs._end;
  copy_example_to_adf(data,ec);
  (**(code **)(base + 0x30))
            (*(undefined8 *)(base + 0x18),*(undefined8 *)(base + 0x20),&data->adf_data);
  peVar4 = *(data->adf_data).ecs.super__Vector_base<example_*,_std::allocator<example_*>_>._M_impl.
            super__Vector_impl_data._M_start;
  sVar5 = data->example_counter;
  data->example_counter = sVar5 + 1;
  local_1b0 = (peVar4->pred).scalars._begin;
  local_208._8_8_ = *(undefined8 *)((long)&peVar4->pred + 8);
  local_1b8 = &std::iterator<std::random_access_iterator_tag,float,long,float*,float>::typeinfo;
  local_208._0_8_ =
       &std::iterator<std::random_access_iterator_tag,float,long,float*,float>::typeinfo;
  iVar7 = exploration::sample_after_normalizing<ACTION_SCORE::score_iterator>
                    (sVar5 + data->app_seed,&local_1b8,&local_208,&local_20c);
  if (iVar7 != 0) {
    std::__cxx11::stringstream::stringstream((stringstream *)&local_1b8);
    std::__ostream_insert<char,std::char_traits<char>>(&local_1a8,"Failed to sample from pdf",0x19);
    pvVar8 = (vw_exception *)__cxa_allocate_exception(0x38);
    std::__cxx11::stringbuf::str();
    VW::vw_exception::vw_exception
              (pvVar8,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/LAIRLAB[P]vowpal_wabbit/vowpalwabbit/cbify.cc"
               ,0xd6,&local_1d8);
    __cxa_throw(pvVar8,&VW::vw_exception::typeinfo,VW::vw_exception::~vw_exception);
  }
  paVar6 = (peVar4->pred).a_s._begin;
  uVar1 = paVar6[local_20c].action;
  uVar9 = uVar1 + 1;
  local_208.action = uVar9;
  local_208.probability = *(float *)((long)(paVar6 + local_20c) + 4);
  if (uVar9 == 0) {
    std::__cxx11::stringstream::stringstream((stringstream *)&local_1b8);
    std::__ostream_insert<char,std::char_traits<char>>
              (&local_1a8,"No action with non-zero probability found!",0x2a);
    pvVar8 = (vw_exception *)__cxa_allocate_exception(0x38);
    std::__cxx11::stringbuf::str();
    VW::vw_exception::vw_exception
              (pvVar8,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/LAIRLAB[P]vowpal_wabbit/vowpalwabbit/cbify.cc"
               ,0xdd,&local_1f8);
    __cxa_throw(pvVar8,&VW::vw_exception::typeinfo,VW::vw_exception::~vw_exception);
  }
  if (pwVar2 == pwVar3) {
    fVar11 = 0.0;
  }
  else {
    fVar11 = 0.0;
    do {
      pwVar10 = pwVar2 + 1;
      if (pwVar2->class_index == uVar9) {
        fVar11 = pwVar2->x;
        break;
      }
      pwVar2 = pwVar10;
    } while (pwVar10 != pwVar3);
  }
  local_208.cost = (data->loss1 - data->loss0) * fVar11 + data->loss0;
  this = &(data->adf_data).ecs.super__Vector_base<example_*,_std::allocator<example_*>_>._M_impl.
          super__Vector_impl_data._M_start[uVar1]->l;
  v_array<CB::cb_class>::clear((v_array<CB::cb_class> *)&this->simple);
  v_array<CB::cb_class>::push_back((v_array<CB::cb_class> *)&this->simple,&local_208);
  (ec->pred).multiclass = local_208.action;
  return;
}

Assistant:

void predict_or_learn_adf(cbify& data, multi_learner& base, example& ec)
{
  // Store the multiclass or cost-sensitive input label
  MULTICLASS::label_t ld;
  COST_SENSITIVE::label csl;
  if (use_cs)
    csl = ec.l.cs;
  else
    ld = ec.l.multi;

  copy_example_to_adf(data, ec);
  base.predict(data.adf_data.ecs);

  auto& out_ec = *data.adf_data.ecs[0];

  uint32_t chosen_action;
  if (sample_after_normalizing(data.app_seed + data.example_counter++, begin_scores(out_ec.pred.a_s),
          end_scores(out_ec.pred.a_s), chosen_action))
    THROW("Failed to sample from pdf");

  CB::cb_class cl;
  cl.action = out_ec.pred.a_s[chosen_action].action + 1;
  cl.probability = out_ec.pred.a_s[chosen_action].score;

  if (!cl.action)
    THROW("No action with non-zero probability found!");

  if (use_cs)
    cl.cost = loss_cs(data, csl.costs, cl.action);
  else
    cl.cost = loss(data, ld.label, cl.action);

  // add cb label to chosen action
  auto& lab = data.adf_data.ecs[cl.action - 1]->l.cb;
  lab.costs.clear();
  lab.costs.push_back(cl);

  if (is_learn)
    base.learn(data.adf_data.ecs);

  ec.pred.multiclass = cl.action;
}